

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_log2_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  uint64_t uVar4;
  undefined4 uVar5;
  ulong uVar6;
  floatx80 fVar7;
  floatx80 fVar8;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 b;
  int32_t aExp;
  uint64_t aSig;
  uint local_34;
  uint64_t local_30;
  
  fVar7.low = a.low;
  uVar6 = a._8_8_ & 0xffffffff;
  local_34 = a._8_4_ & 0x7fff;
  local_30 = fVar7.low;
  if ((~a._8_4_ & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      fVar7._8_8_ = uVar6;
      propagateFloatx80NaNOneArg(fVar7,status);
    }
    if (-1 < (short)uVar6) {
      uVar5 = 0x7fff;
      uVar4 = 0;
      goto LAB_006f0a2c;
    }
  }
  if (local_34 == 0) {
    if (local_30 == 0) {
      float_raise_m68k('\x04',status);
      uVar4 = 0;
      uVar5 = 0xffff;
      goto LAB_006f0a2c;
    }
    normalizeFloatx80Subnormal_m68k(local_30,(int32_t *)&local_34,&local_30);
  }
  if ((short)uVar6 < 0) {
    float_raise_m68k('\x01',status);
    fVar7 = floatx80_default_nan_m68k(status);
    uVar4 = fVar7.low;
    uVar5 = fVar7._8_4_;
  }
  else {
    cVar1 = status->float_rounding_mode;
    cVar2 = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    if (local_30 == 0x8000000000000000) {
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      fVar7 = int32_to_floatx80_m68k(local_34 - 0x3fff,status);
      auVar3 = fVar7._0_12_;
    }
    else {
      a_00._8_8_ = uVar6;
      a_00.low = fVar7.low;
      fVar7 = floatx80_logn_m68k(a_00,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      auVar3 = fVar7._0_12_;
      a_01._12_4_ = 0;
      a_01.low = auVar3._0_8_;
      a_01.high = auVar3._8_2_;
      a_01._10_2_ = auVar3._10_2_;
      b._8_8_ = 0x3fff;
      b.low = 0xb8aa3b295c17f0bc;
      fVar7 = floatx80_mul_m68k(a_01,b,status);
      auVar3 = fVar7._0_12_;
    }
    uVar4 = auVar3._0_8_;
    uVar5 = auVar3._8_4_;
    float_raise_m68k(' ',status);
  }
LAB_006f0a2c:
  fVar8._8_4_ = uVar5;
  fVar8.low = uVar4;
  fVar8._12_4_ = 0;
  return fVar8;
}

Assistant:

floatx80 floatx80_log2(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    floatx80 fp0, fp1;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign == 0) {
            return packFloatx80(0, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
    }

    if (aExp == 0) {
        if (aSig == 0) {
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(1, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
        normalizeFloatx80Subnormal(aSig, &aExp, &aSig);
    }

    if (aSign) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    if (aSig == one_sig) { /* X is 2^k */
        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = int32_to_floatx80(aExp - 0x3FFF, status);
    } else {
        fp0 = floatx80_logn(a, status);
        fp1 = packFloatx80(0, 0x3FFF, UINT64_C(0xB8AA3B295C17F0BC)); /* INV_L2 */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_mul(fp0, fp1, status); /* LOGN(X)*INV_L2 */
    }

    float_raise(float_flag_inexact, status);

    return a;
}